

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O1

void __thiscall QIBusEngineDesc::serializeTo(QIBusEngineDesc *this,QDBusArgument *argument)

{
  QDBusArgument::beginStructure();
  QIBusSerializable::serializeTo(&this->super_QIBusSerializable,argument);
  QDBusArgument::operator<<(argument,&this->engine_name);
  QDBusArgument::operator<<(argument,&this->longname);
  QDBusArgument::operator<<(argument,&this->description);
  QDBusArgument::operator<<(argument,&this->language);
  QDBusArgument::operator<<(argument,&this->license);
  QDBusArgument::operator<<(argument,&this->author);
  QDBusArgument::operator<<(argument,&this->icon);
  QDBusArgument::operator<<(argument,&this->layout);
  QDBusArgument::operator<<(argument,this->rank);
  QDBusArgument::operator<<(argument,&this->hotkeys);
  QDBusArgument::operator<<(argument,&this->symbol);
  QDBusArgument::operator<<(argument,&this->setup);
  QDBusArgument::operator<<(argument,&this->layout_variant);
  QDBusArgument::operator<<(argument,&this->layout_option);
  QDBusArgument::operator<<(argument,&this->version);
  QDBusArgument::operator<<(argument,&this->textdomain);
  QDBusArgument::operator<<(argument,&this->iconpropkey);
  QDBusArgument::endStructure();
  return;
}

Assistant:

void QIBusEngineDesc::serializeTo(QDBusArgument &argument) const
{
    argument.beginStructure();

    QIBusSerializable::serializeTo(argument);

    argument << engine_name;
    argument << longname;
    argument << description;
    argument << language;
    argument << license;
    argument << author;
    argument << icon;
    argument << layout;
    argument << rank;
    argument << hotkeys;
    argument << symbol;
    argument << setup;
    argument << layout_variant;
    argument << layout_option;
    argument << version;
    argument << textdomain;
    argument << iconpropkey;

    argument.endStructure();
}